

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void SplitUVRow_C(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)width - 1;
  if (1 < width) {
    uVar2 = 0;
    do {
      dst_u[uVar2] = *src_uv;
      dst_u[uVar2 + 1] = src_uv[2];
      dst_v[uVar2] = src_uv[1];
      dst_v[uVar2 + 1] = src_uv[3];
      src_uv = src_uv + 4;
      uVar2 = uVar2 + 2;
    } while (uVar2 < (uVar1 & 0xffffffff));
  }
  if ((width & 1U) != 0) {
    dst_u[uVar1] = *src_uv;
    dst_v[uVar1] = src_uv[1];
  }
  return;
}

Assistant:

void SplitUVRow_C(const uint8_t* src_uv,
                  uint8_t* dst_u,
                  uint8_t* dst_v,
                  int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_u[x] = src_uv[0];
    dst_u[x + 1] = src_uv[2];
    dst_v[x] = src_uv[1];
    dst_v[x + 1] = src_uv[3];
    src_uv += 4;
  }
  if (width & 1) {
    dst_u[width - 1] = src_uv[0];
    dst_v[width - 1] = src_uv[1];
  }
}